

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall NumberTemp::ProcessInstr(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  SymID stackSymID;
  Type TVar1;
  Opnd *this_00;
  SymTable *this_01;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  NumberTemp *pNVar7;
  Type_conflict pBVar8;
  StackSym *pSVar9;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  RegOpnd *pRVar10;
  PropertySym *pPVar11;
  BVSparse<Memory::JitArenaAllocator> **ppBVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (instr->m_opcode == BailOnNoProfile) {
    pNVar7 = this;
    if (this->nonTempElemLoad == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,600,"(!this->nonTempElemLoad)","!this->nonTempElemLoad");
      if (!bVar4) goto LAB_006391ef;
      *puVar6 = 0;
    }
    do {
      pNVar7 = (NumberTemp *)(pNVar7->super_TempTrackerBase).nonTempSyms.head;
      if (pNVar7 == (NumberTemp *)0x0) goto LAB_00638ea5;
    } while (((Type *)&(pNVar7->super_TempTrackerBase).nonTempSyms.alloc)->word == 0);
    if (pNVar7 != (NumberTemp *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x259,"(this->nonTempSyms.IsEmpty())","this->nonTempSyms.IsEmpty()");
      if (!bVar4) goto LAB_006391ef;
      *puVar6 = 0;
    }
LAB_00638ea5:
    pBVar8 = (Type_conflict)&(this->super_TempTrackerBase).tempTransferredSyms;
    do {
      pBVar8 = pBVar8->next;
      if (pBVar8 == (Type_conflict)0x0) goto LAB_00638f13;
    } while ((pBVar8->data).word == 0);
    if (pBVar8 != (Type_conflict)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25a,"(this->tempTransferredSyms.IsEmpty())",
                         "this->tempTransferredSyms.IsEmpty()");
      if (!bVar4) goto LAB_006391ef;
      *puVar6 = 0;
    }
LAB_00638f13:
    pBVar8 = (Type_conflict)&this->elemLoadDependencies;
    do {
      pBVar8 = pBVar8->next;
      if (pBVar8 == (Type_conflict)0x0) goto LAB_00638f81;
    } while ((pBVar8->data).word == 0);
    if (pBVar8 != (Type_conflict)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25b,"(this->elemLoadDependencies.IsEmpty())",
                         "this->elemLoadDependencies.IsEmpty()");
      if (!bVar4) goto LAB_006391ef;
      *puVar6 = 0;
    }
LAB_00638f81:
    pBVar8 = (Type_conflict)&this->upwardExposedMarkTempObjectLiveFields;
    do {
      pBVar8 = pBVar8->next;
      if (pBVar8 == (Type_conflict)0x0) goto LAB_00638ff2;
    } while ((pBVar8->data).word == 0);
    if (pBVar8 != (Type_conflict)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x25c,"(this->upwardExposedMarkTempObjectLiveFields.IsEmpty())",
                         "this->upwardExposedMarkTempObjectLiveFields.IsEmpty()");
      if (!bVar4) goto LAB_006391ef;
      *puVar6 = 0;
    }
  }
LAB_00638ff2:
  bVar4 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if ((((bVar4) && ((this->nonTempElemLoad & 1U) == 0)) &&
      (this_00 = instr->m_dst, this_00 != (Opnd *)0x0)) &&
     (OVar5 = IR::Opnd::GetKind(this_00), OVar5 == OpndKindReg)) {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_006391ef:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pSVar9 = (StackSym *)this_00[1]._vptr_Opnd;
    if (((pSVar9->m_type == TyVar) ||
        (pSVar9 = StackSym::GetVarEquivSym(pSVar9,(Func *)0x0), pSVar9 != (StackSym *)0x0)) &&
       ((this->upwardExposedMarkTempObjectSymsProperties !=
         (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0 &&
        (bv2 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
                         (this->upwardExposedMarkTempObjectSymsProperties,(pSVar9->super_Sym).m_id),
        bv2 != (BVSparse<Memory::JitArenaAllocator> *)0x0)))) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this->upwardExposedMarkTempObjectLiveFields,bv2);
      bVar4 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
      if ((bVar4) && (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindReg)) {
        pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src1);
        pSVar9 = Sym::AsStackSym(&pRVar10->m_sym->super_Sym);
        stackSymID = (pSVar9->super_Sym).m_id;
        pBVar8 = bv2->head;
        if (pBVar8 != (Type_conflict)0x0) {
          this_01 = backwardPass->func->m_symTable;
          do {
            uVar14 = (pBVar8->data).word;
            if (uVar14 != 0) {
              TVar1 = pBVar8->startIndex;
              uVar13 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              do {
                BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar13);
                pPVar11 = SymTable::FindPropertySym(this_01,stackSymID,(BVIndex)uVar13 + TVar1);
                if (pPVar11 != (PropertySym *)0x0) {
                  BVSparse<Memory::JitArenaAllocator>::Set
                            (&this->upwardExposedMarkTempObjectLiveFields,(pPVar11->super_Sym).m_id)
                  ;
                }
                uVar14 = uVar14 & ~(1L << (uVar13 & 0x3f));
                lVar2 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                  }
                }
                uVar13 = (ulong)(-(uint)(uVar14 == 0) | (uint)lVar2);
              } while (uVar14 != 0);
            }
            pBVar8 = pBVar8->next;
          } while (pBVar8 != (Type)0x0);
        }
        ppBVar12 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                   FindOrInsert(this->upwardExposedMarkTempObjectSymsProperties,bv2,stackSymID);
        if (ppBVar12 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
          return;
        }
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>(*ppBVar12,bv2);
      }
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                ((this->super_TempTrackerBase).nonTempSyms.alloc,bv2);
      return;
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessInstr(IR::Instr * instr, BackwardPass * backwardPass)
{
#if DBG
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile)
    {
        // If we see BailOnNoProfile, we shouldn't have any successor to have any non temp syms
        Assert(!this->nonTempElemLoad);
        Assert(this->nonTempSyms.IsEmpty());
        Assert(this->tempTransferredSyms.IsEmpty());
        Assert(this->elemLoadDependencies.IsEmpty());
        Assert(this->upwardExposedMarkTempObjectLiveFields.IsEmpty());
    }
#endif

    // We don't get to process all dst in MarkTemp. Do it here for the upwardExposedMarkTempObjectLiveFields
    if (!this->DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        return;
    }

    IR::Opnd * dst = instr->GetDst();
    if (dst == nullptr || !dst->IsRegOpnd())
    {
        return;
    }
    StackSym * dstSym = dst->AsRegOpnd()->m_sym;
    if (!dstSym->IsVar())
    {
        dstSym = dstSym->GetVarEquivSym(nullptr);
        if (dstSym == nullptr)
        {
            return;
        }
    }

    SymID dstSymId = dstSym->m_id;
    if (this->upwardExposedMarkTempObjectSymsProperties)
    {
        // We are assigning to dstSym, it no longer has upward exposed use, get the information and clear it from the hash table
        BVSparse<JitArenaAllocator> * dstBv = this->upwardExposedMarkTempObjectSymsProperties->GetAndClear(dstSymId);
        if (dstBv)
        {
            // Clear the upward exposed live fields of all the property sym id associated to dstSym
            this->upwardExposedMarkTempObjectLiveFields.Minus(dstBv);
            if (ObjectTemp::IsTempTransfer(instr) && instr->GetSrc1()->IsRegOpnd())
            {
                // If it is transfer, copy the dst info to the src
                SymID srcStackSymId = instr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->m_id;

                SymTable * symTable = backwardPass->func->m_symTable;
                FOREACH_BITSET_IN_SPARSEBV(index, dstBv)
                {
                    PropertySym * propertySym = symTable->FindPropertySym(srcStackSymId, index);
                    if (propertySym)
                    {
                        this->upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;

                BVSparse<JitArenaAllocator> ** srcBv = this->upwardExposedMarkTempObjectSymsProperties->FindOrInsert(dstBv, srcStackSymId);
                if (srcBv)
                {
                    (*srcBv)->Or(dstBv);
                    JitAdelete(this->GetAllocator(), dstBv);
                }
            }
            else
            {
                JitAdelete(this->GetAllocator(), dstBv);
            }
        }
    }
}